

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall
ELFIO::elfio::write_segment_data
          (elfio *this,segment *seg,vector<bool,_std::allocator<bool>_> *section_generated,
          Elf_Xword *segment_memory,Elf_Xword *segment_filesize,Elf_Xword *seg_start_pos)

{
  Elf_Xword *pEVar1;
  elfio *peVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  bool bVar5;
  char cVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ushort uVar16;
  ulong uVar17;
  _Head_base<0UL,_ELFIO::section_*,_false> _Var18;
  bool local_69;
  long local_38;
  
  sVar7 = (**(code **)(*(long *)seg + 0xb0))(seg);
  local_69 = sVar7 == 0;
  if (!local_69) {
    pEVar1 = &this->current_file_pos;
    uVar16 = 0;
    do {
      uVar8 = (**(code **)(*(long *)seg + 0xb8))(seg,uVar16);
      peVar2 = (this->sections).parent;
      puVar3 = (peVar2->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar8 <
          (ulong)((long)(peVar2->sections_).
                        super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        _Var18._M_head_impl =
             *(section **)
              &puVar3[uVar8]._M_t.
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
      }
      else {
        _Var18._M_head_impl = (section *)0x0;
      }
      iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl);
      uVar17 = 1L << ((byte)uVar8 & 0x3f);
      uVar8 = uVar8 >> 6;
      p_Var4 = (section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar14 = p_Var4[uVar8];
      if (iVar9 == 0) {
        puVar15 = p_Var4 + uVar8;
LAB_001077ca:
        bVar5 = false;
        *puVar15 = uVar14 | uVar17;
      }
      else if (((((uVar14 & uVar17) == 0) &&
                (cVar6 = (**(code **)(*(long *)_Var18._M_head_impl + 0x130))(_Var18._M_head_impl),
                cVar6 != '\0')) &&
               (iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl),
               iVar9 != 8)) &&
              ((iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl),
               iVar9 != 0 &&
               (lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x98))(_Var18._M_head_impl),
               lVar11 != 0)))) {
        lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x88))(_Var18._M_head_impl);
        lVar12 = (**(code **)(*(long *)seg + 0x48))(seg);
        uVar13 = this->current_file_pos - *seg_start_pos;
        bVar5 = true;
        uVar14 = (lVar11 - lVar12) - uVar13;
        if (uVar13 <= (ulong)(lVar11 - lVar12)) goto LAB_001076ad;
      }
      else {
        if ((((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8] & uVar17) == 0)
           && (cVar6 = (**(code **)(*(long *)_Var18._M_head_impl + 0x130))(_Var18._M_head_impl),
              cVar6 == '\0')) {
          lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x68))(_Var18._M_head_impl);
          uVar14 = lVar11 + (ulong)(lVar11 == 0);
          uVar14 = (uVar14 - this->current_file_pos % uVar14) % uVar14;
        }
        else if (((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8] & uVar17)
                 == 0) {
          uVar14 = 0;
        }
        else {
          lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0xb8))(_Var18._M_head_impl);
          uVar14 = lVar11 - (*seg_start_pos + *segment_filesize);
        }
LAB_001076ad:
        uVar13 = (**(code **)(*(long *)_Var18._M_head_impl + 0x38))(_Var18._M_head_impl);
        if (((uVar13 & 2) != 0) &&
           (((uVar10 = (**(code **)(*(long *)_Var18._M_head_impl + 0x38))(_Var18._M_head_impl),
             (uVar10 >> 10 & 1) == 0 ||
             (iVar9 = (**(code **)(*(long *)seg + 0x18))(seg), iVar9 == 7)) ||
            (iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl),
            iVar9 != 8)))) {
          lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x98))(_Var18._M_head_impl);
          *segment_memory = *segment_memory + lVar11 + uVar14;
        }
        iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl);
        if (iVar9 != 8) {
          lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x98))(_Var18._M_head_impl);
          *segment_filesize = *segment_filesize + lVar11 + uVar14;
        }
        bVar5 = false;
        if (((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8] & uVar17) == 0)
        {
          *pEVar1 = *pEVar1 + uVar14;
          cVar6 = (**(code **)(*(long *)_Var18._M_head_impl + 0x130))(_Var18._M_head_impl);
          if (cVar6 == '\0') {
            lVar11 = (**(code **)(*(long *)seg + 0x48))(seg);
            local_38 = (lVar11 + *pEVar1) - *seg_start_pos;
            (**(code **)(*(long *)_Var18._M_head_impl + 0x90))(_Var18._M_head_impl,&local_38);
          }
          sVar7 = (**(code **)(*(long *)_Var18._M_head_impl + 0x10))(_Var18._M_head_impl);
          if (sVar7 != 0) {
            (**(code **)(*(long *)_Var18._M_head_impl + 0x110))(_Var18._M_head_impl,pEVar1);
          }
          iVar9 = (**(code **)(*(long *)_Var18._M_head_impl + 0x28))(_Var18._M_head_impl);
          if (iVar9 != 8) {
            lVar11 = (**(code **)(*(long *)_Var18._M_head_impl + 0x98))(_Var18._M_head_impl);
            *pEVar1 = *pEVar1 + lVar11;
          }
          puVar15 = (section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar8;
          uVar14 = *puVar15;
          goto LAB_001077ca;
        }
      }
      if (bVar5) {
        return local_69;
      }
      uVar16 = uVar16 + 1;
      uVar8 = (**(code **)(*(long *)seg + 0xb0))(seg);
      local_69 = uVar16 >= uVar8;
    } while (uVar16 < uVar8);
  }
  return local_69;
}

Assistant:

bool write_segment_data( const segment*     seg,
                             std::vector<bool>& section_generated,
                             Elf_Xword&         segment_memory,
                             Elf_Xword&         segment_filesize,
                             const Elf_Xword&   seg_start_pos )
    {
        for ( Elf_Half j = 0; j < seg->get_sections_num(); ++j ) {
            Elf_Half index = seg->get_section_index_at( j );

            section* sec = sections[index];

            // The NULL section is always generated
            if ( SHT_NULL == sec->get_type() ) {
                section_generated[index] = true;
                continue;
            }

            Elf_Xword section_align = 0;
            // Fix up the alignment
            if ( !section_generated[index] && sec->is_address_initialized() &&
                 SHT_NOBITS != sec->get_type() && SHT_NULL != sec->get_type() &&
                 0 != sec->get_size() ) {
                // Align the sections based on the virtual addresses
                // when possible (this is what matters for execution)
                Elf64_Off req_offset =
                    sec->get_address() - seg->get_virtual_address();
                Elf64_Off cur_offset = current_file_pos - seg_start_pos;
                if ( req_offset < cur_offset ) {
                    // something has gone awfully wrong, abort!
                    // section_align would turn out negative, seeking backwards and overwriting previous data
                    return false;
                }
                section_align = req_offset - cur_offset;
            }
            else if ( !section_generated[index] &&
                      !sec->is_address_initialized() ) {
                // If no address has been specified then only the section
                // alignment constraint has to be matched
                Elf_Xword align = sec->get_addr_align();
                if ( align == 0 ) {
                    align = 1;
                }
                Elf64_Off error = current_file_pos % align;
                section_align   = ( align - error ) % align;
            }
            else if ( section_generated[index] ) {
                // Alignment for already generated sections
                section_align =
                    sec->get_offset() - seg_start_pos - segment_filesize;
            }

            // Determine the segment file and memory sizes
            // Special case .tbss section (NOBITS) in non TLS segment
            if ( ( ( sec->get_flags() & SHF_ALLOC ) == SHF_ALLOC ) &&
                 !( ( ( sec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                    ( seg->get_type() != PT_TLS ) &&
                    ( SHT_NOBITS == sec->get_type() ) ) ) {
                segment_memory += sec->get_size() + section_align;
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                segment_filesize += sec->get_size() + section_align;
            }

            // Nothing to be done when generating nested segments
            if ( section_generated[index] ) {
                continue;
            }

            current_file_pos += section_align;

            // Set the section addresses when missing
            if ( !sec->is_address_initialized() ) {
                sec->set_address( seg->get_virtual_address() +
                                  current_file_pos - seg_start_pos );
            }

            if ( 0 != sec->get_index() ) {
                sec->set_offset( current_file_pos );
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                current_file_pos += sec->get_size();
            }

            section_generated[index] = true;
        }

        return true;
    }